

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteGroupMaybeToArray
               (int field_number,MessageLite *value,CodedOutputStream *output)

{
  uint32 uVar1;
  int size_00;
  int size;
  CodedOutputStream *output_local;
  MessageLite *value_local;
  int field_number_local;
  
  uVar1 = MakeTag(field_number,WIRETYPE_START_GROUP);
  io::CodedOutputStream::WriteTag(output,uVar1);
  size_00 = (*value->_vptr_MessageLite[10])();
  WriteSubMessageMaybeToArray(size_00,value,output);
  uVar1 = MakeTag(field_number,WIRETYPE_END_GROUP);
  io::CodedOutputStream::WriteTag(output,uVar1);
  return;
}

Assistant:

void WireFormatLite::WriteGroupMaybeToArray(int field_number,
                                            const MessageLite& value,
                                            io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_START_GROUP, output);
  const int size = value.GetCachedSize();
  WriteSubMessageMaybeToArray(size, value, output);
  WriteTag(field_number, WIRETYPE_END_GROUP, output);
}